

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  vector<Reading,_std::allocator<Reading>_> readings;
  vector<Reading,_std::allocator<Reading>_> local_60;
  double local_48;
  double local_40;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"raw_temps.txt","");
  get_readings_from_file(&local_60,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_48 = get_mean_temp(&local_60);
  local_40 = get_median_temp(&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Median temperature: ",0x14);
  poVar1 = std::ostream::_M_insert<double>(local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", mean temperature: ",0x14);
  poVar1 = std::ostream::_M_insert<double>(local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_60.super__Vector_base<Reading,_std::allocator<Reading>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<Reading,_std::allocator<Reading>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<Reading,_std::allocator<Reading>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<Reading,_std::allocator<Reading>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	const char* file_name{ "raw_temps.txt" };
	try
	{
		auto readings = get_readings_from_file(file_name);
		auto mean = get_mean_temp(readings);
		auto median = get_median_temp(readings);
		std::cout << "Median temperature: " << median
			<< ", mean temperature: " << mean << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}